

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void vkt::Draw::createTopologyGroups(TestCaseGroup *testGroup,DrawCommandType cmdType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestContext *testCtx;
  char *__s;
  TestNode *node;
  long lVar2;
  TestContext *pTVar3;
  string groupName;
  allocator<char> local_99;
  TestNode *local_98;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &local_90.field_2;
  pTVar3 = (TestContext *)(ulong)cmdType;
  lVar2 = 0;
  local_98 = &testGroup->super_TestNode;
  do {
    __s = ::vk::getPrimitiveTopologyName((VkPrimitiveTopology)lVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_99);
    de::toLower(&local_90,&local_70);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Testcases with a specific topology.","");
    testCtx = local_98->m_testCtx;
    node = (TestNode *)operator_new(0x80);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,(char *)local_50[0],local_90._M_dataplus._M_p);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2b918;
    node[1]._vptr_TestNode = (_func_int **)populateSubGroup;
    node[1].m_testCtx = pTVar3;
    tcu::TestNode::addChild(local_98,node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar2 = lVar2 + 1;
    pTVar3 = (TestContext *)&pTVar3[0x2aaaaaa].m_testResultDesc._M_string_length;
  } while (lVar2 != 10);
  return;
}

Assistant:

void createTopologyGroups (tcu::TestCaseGroup* testGroup, const DrawCommandType cmdType)
{
	for (deUint32 idx = 0; idx != vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST; ++idx)
	{
		const vk::VkPrimitiveTopology	topology	= vk::VkPrimitiveTopology(idx);
		const std::string				groupName	= de::toLower(getPrimitiveTopologyName(topology)).substr(22);
		addTestGroup(testGroup, groupName, "Testcases with a specific topology.", populateSubGroup, TestCaseParams(cmdType, topology));
	}
}